

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Terminal.c
# Opt level: O1

void kwsysTerminalSetVT100Color(FILE *stream,int color)

{
  uint uVar1;
  size_t __size;
  char *pcVar2;
  
  if (color == 0) {
    pcVar2 = "\x1b[0m";
    goto LAB_00141cd2;
  }
  switch(color & 0xf) {
  case 0:
    pcVar2 = "\x1b[0m";
    __size = 4;
    goto LAB_00141c7f;
  case 1:
    pcVar2 = "\x1b[30m";
    break;
  case 2:
    pcVar2 = "\x1b[31m";
    break;
  case 3:
    pcVar2 = "\x1b[32m";
    break;
  case 4:
    pcVar2 = "\x1b[33m";
    break;
  case 5:
    pcVar2 = "\x1b[34m";
    break;
  case 6:
    pcVar2 = "\x1b[35m";
    break;
  case 7:
    pcVar2 = "\x1b[36m";
    break;
  case 8:
    pcVar2 = "\x1b[37m";
    break;
  default:
    goto switchD_00141c18_default;
  }
  __size = 5;
LAB_00141c7f:
  fwrite(pcVar2,__size,1,(FILE *)stream);
switchD_00141c18_default:
  uVar1 = (color & 0xf0U) - 0x10;
  if (uVar1 < 0x80) {
    fwrite(&DAT_001d6644 + *(int *)(&DAT_001d6644 + (uVar1 >> 2)),5,1,(FILE *)stream);
  }
  if (((uint)color >> 8 & 1) == 0) {
    return;
  }
  pcVar2 = "\x1b[1m";
LAB_00141cd2:
  fwrite(pcVar2,4,1,(FILE *)stream);
  return;
}

Assistant:

static void kwsysTerminalSetVT100Color(FILE* stream, int color)
{
  if(color == kwsysTerminal_Color_Normal)
    {
    fprintf(stream, KWSYS_TERMINAL_VT100_NORMAL);
    return;
    }

  switch(color & kwsysTerminal_Color_ForegroundMask)
    {
    case kwsysTerminal_Color_Normal:
      fprintf(stream, KWSYS_TERMINAL_VT100_NORMAL);
      break;
    case kwsysTerminal_Color_ForegroundBlack:
      fprintf(stream, KWSYS_TERMINAL_VT100_FOREGROUND_BLACK);
      break;
    case kwsysTerminal_Color_ForegroundRed:
      fprintf(stream, KWSYS_TERMINAL_VT100_FOREGROUND_RED);
      break;
    case kwsysTerminal_Color_ForegroundGreen:
      fprintf(stream, KWSYS_TERMINAL_VT100_FOREGROUND_GREEN);
      break;
    case kwsysTerminal_Color_ForegroundYellow:
      fprintf(stream, KWSYS_TERMINAL_VT100_FOREGROUND_YELLOW);
      break;
    case kwsysTerminal_Color_ForegroundBlue:
      fprintf(stream, KWSYS_TERMINAL_VT100_FOREGROUND_BLUE);
      break;
    case kwsysTerminal_Color_ForegroundMagenta:
      fprintf(stream, KWSYS_TERMINAL_VT100_FOREGROUND_MAGENTA);
      break;
    case kwsysTerminal_Color_ForegroundCyan:
      fprintf(stream, KWSYS_TERMINAL_VT100_FOREGROUND_CYAN);
      break;
    case kwsysTerminal_Color_ForegroundWhite:
      fprintf(stream, KWSYS_TERMINAL_VT100_FOREGROUND_WHITE);
      break;
    }
  switch(color & kwsysTerminal_Color_BackgroundMask)
    {
    case kwsysTerminal_Color_BackgroundBlack:
      fprintf(stream, KWSYS_TERMINAL_VT100_BACKGROUND_BLACK);
      break;
    case kwsysTerminal_Color_BackgroundRed:
      fprintf(stream, KWSYS_TERMINAL_VT100_BACKGROUND_RED);
      break;
    case kwsysTerminal_Color_BackgroundGreen:
      fprintf(stream, KWSYS_TERMINAL_VT100_BACKGROUND_GREEN);
      break;
    case kwsysTerminal_Color_BackgroundYellow:
      fprintf(stream, KWSYS_TERMINAL_VT100_BACKGROUND_YELLOW);
      break;
    case kwsysTerminal_Color_BackgroundBlue:
      fprintf(stream, KWSYS_TERMINAL_VT100_BACKGROUND_BLUE);
      break;
    case kwsysTerminal_Color_BackgroundMagenta:
      fprintf(stream, KWSYS_TERMINAL_VT100_BACKGROUND_MAGENTA);
      break;
    case kwsysTerminal_Color_BackgroundCyan:
      fprintf(stream, KWSYS_TERMINAL_VT100_BACKGROUND_CYAN);
      break;
    case kwsysTerminal_Color_BackgroundWhite:
      fprintf(stream, KWSYS_TERMINAL_VT100_BACKGROUND_WHITE);
      break;
    }
  if(color & kwsysTerminal_Color_ForegroundBold)
    {
    fprintf(stream, KWSYS_TERMINAL_VT100_BOLD);
    }
}